

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasSlCrank_FSA_dns.c
# Opt level: O3

void setIC(N_Vector yy,N_Vector yp,UserData data)

{
  double dVar1;
  sunrealtype sVar2;
  sunrealtype sVar3;
  N_Vector yy_00;
  long lVar4;
  SUNContext __x;
  N_Vector_Ops p_Var5;
  undefined1 auVar6 [16];
  sunrealtype Q [3];
  undefined1 local_38 [16];
  double local_28;
  
  N_VConst();
  N_VConst(yp);
  dVar1 = data->J2;
  sVar2 = data->J1;
  sVar3 = data->m2;
  __x = (SUNContext)asin(-data->a);
  p_Var5 = (N_Vector_Ops)cos((double)__x);
  yy_00 = *(N_Vector *)((long)yy->content + 0x10);
  yy_00->content = (void *)0x3ff921fb54442d18;
  yy_00->ops = p_Var5;
  yy_00->sunctx = __x;
  force(yy_00,(sunrealtype *)local_38,data);
  lVar4 = *(long *)((long)yp->content + 0x10);
  auVar6._8_8_ = sVar3;
  auVar6._0_8_ = sVar2;
  auVar6 = divpd(local_38,auVar6);
  *(undefined1 (*) [16])(lVar4 + 0x18) = auVar6;
  *(double *)(lVar4 + 0x28) = local_28 / dVar1;
  return;
}

Assistant:

static void setIC(N_Vector yy, N_Vector yp, UserData data)
{
  sunrealtype pi;
  sunrealtype a, J1, m2, J2;
  sunrealtype q, p, x;
  sunrealtype Q[3];

  N_VConst(ZERO, yy);
  N_VConst(ZERO, yp);

  pi = FOUR * atan(ONE);

  a  = data->a;
  J1 = data->J1;
  m2 = data->m2;
  J2 = data->J2;

  q = pi / TWO;
  p = asin(-a);
  x = cos(p);

  NV_Ith_S(yy, 0) = q;
  NV_Ith_S(yy, 1) = x;
  NV_Ith_S(yy, 2) = p;

  force(yy, Q, data);

  NV_Ith_S(yp, 3) = Q[0] / J1;
  NV_Ith_S(yp, 4) = Q[1] / m2;
  NV_Ith_S(yp, 5) = Q[2] / J2;
}